

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qselect.c
# Opt level: O0

double dqselect(int n,double *A,int k)

{
  double dVar1;
  int iVar2;
  int local_40;
  int local_3c;
  double val;
  int p;
  int j;
  int i;
  int k_local;
  double *A_local;
  int n_local;
  
  local_3c = k;
  if (k < 1) {
    local_3c = 0;
  }
  if (local_3c < n + -1) {
    local_40 = local_3c;
  }
  else {
    local_40 = n + -1;
  }
  j = local_40;
  _i = A;
  A_local._4_4_ = n;
  while( true ) {
    if (A_local._4_4_ < 2) {
      return *_i;
    }
    p = 0;
    val._0_4_ = A_local._4_4_ + -1;
    dVar1 = _i[val._0_4_];
    val._4_4_ = val._0_4_;
    while (p < val._4_4_) {
      for (; dVar1 <= _i[p] && p < val._0_4_; p = p + 1) {
      }
      if (_i[p] < dVar1) {
        _i[val._0_4_] = _i[p];
        val._0_4_ = p;
      }
      for (; _i[val._4_4_] <= dVar1 && val._0_4_ < val._4_4_; val._4_4_ = val._4_4_ + -1) {
      }
      if (dVar1 < _i[val._4_4_]) {
        _i[val._0_4_] = _i[val._4_4_];
        val._0_4_ = val._4_4_;
      }
    }
    _i[val._0_4_] = dVar1;
    if (val._0_4_ == j) break;
    if (j < val._0_4_) {
      A_local._4_4_ = val._0_4_;
    }
    else {
      iVar2 = val._0_4_ + 1;
      A_local._4_4_ = A_local._4_4_ - iVar2;
      _i = _i + iVar2;
      j = j - iVar2;
    }
  }
  return dVar1;
}

Assistant:

double dqselect(int n, double A[], int k)
{
    register int i, j, p;
    register double val;

    k = SUPERLU_MAX(k, 0);
    k = SUPERLU_MIN(k, n - 1);
    while (n > 1)
    {
	i = 0; j = n-1;
	p = j; val = A[p];
	while (i < j)
	{
	    for (; A[i] >= val && i < p; i++);
	    if (A[i] < val) { A[p] = A[i]; p = i; }
	    for (; A[j] <= val && j > p; j--);
	    if (A[j] > val) { A[p] = A[j]; p = j; }
	}
	A[p] = val;
	if (p == k) return val;
	else if (p > k) n = p;
	else
	{
	    p++;
	    n -= p; A += p; k -= p;
	}
    }

    return A[0];
}